

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr valuePop(xmlXPathParserContextPtr ctxt)

{
  int iVar1;
  xmlXPathObjectPtr *ppxVar2;
  uint uVar3;
  xmlXPathObjectPtr pxVar4;
  
  if (ctxt != (xmlXPathParserContextPtr)0x0) {
    iVar1 = ctxt->valueNr;
    if (0 < (long)iVar1) {
      uVar3 = iVar1 - 1;
      ctxt->valueNr = uVar3;
      ppxVar2 = ctxt->valueTab;
      if (iVar1 == 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar4 = ppxVar2[(long)iVar1 + -2];
      }
      ctxt->value = pxVar4;
      pxVar4 = ppxVar2[uVar3];
      ppxVar2[uVar3] = (xmlXPathObjectPtr)0x0;
      return pxVar4;
    }
  }
  return (xmlXPathObjectPtr)0x0;
}

Assistant:

xmlXPathObjectPtr
valuePop(xmlXPathParserContextPtr ctxt)
{
    xmlXPathObjectPtr ret;

    if ((ctxt == NULL) || (ctxt->valueNr <= 0))
        return (NULL);

    ctxt->valueNr--;
    if (ctxt->valueNr > 0)
        ctxt->value = ctxt->valueTab[ctxt->valueNr - 1];
    else
        ctxt->value = NULL;
    ret = ctxt->valueTab[ctxt->valueNr];
    ctxt->valueTab[ctxt->valueNr] = NULL;
    return (ret);
}